

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O1

string * __thiscall
TestNLHandler::MakeVarArg
          (string *__return_storage_ptr__,TestNLHandler *this,string *op,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  char *pcVar1;
  pointer __src;
  ulong size;
  size_t sVar2;
  char *pcVar3;
  Buffer<char> *pBVar4;
  char *str;
  size_t new_size;
  MemoryWriter w;
  Writer local_258;
  MemoryBuffer<char,_500UL,_std::allocator<char>_> local_248;
  
  local_258.buffer_ = &local_248.super_Buffer<char>;
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002f1120;
  pcVar1 = local_248.data_;
  local_248.super_Buffer<char>.size_ = 0;
  local_248.super_Buffer<char>.capacity_ = 500;
  local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002f1168;
  __src = (op->_M_dataplus)._M_p;
  size = op->_M_string_length;
  local_248.super_Buffer<char>.ptr_ = pcVar1;
  if (500 < size) {
    fmt::internal::MemoryBuffer<char,_500UL,_std::allocator<char>_>::grow
              ((MemoryBuffer<char,_500UL,_std::allocator<char>_> *)local_258.buffer_,size);
  }
  if (size != 0) {
    memmove(local_248.super_Buffer<char>.ptr_ + local_248.super_Buffer<char>.size_,__src,size);
  }
  pBVar4 = local_258.buffer_;
  sVar2 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  local_248.super_Buffer<char>.size_ = size;
  if (sVar2 == ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_) {
    (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)
              (local_258.buffer_,sVar2 + 1);
  }
  sVar2 = ((Buffer<char> *)&pBVar4->_vptr_Buffer)->size_;
  ((Buffer<char> *)&pBVar4->_vptr_Buffer)->size_ = sVar2 + 1;
  ((Buffer<char> *)&pBVar4->_vptr_Buffer)->ptr_[sVar2] = '(';
  WriteList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(&local_258,args)
  ;
  pBVar4 = local_258.buffer_;
  sVar2 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  if (sVar2 == ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->capacity_) {
    (**((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->_vptr_Buffer)
              (local_258.buffer_,sVar2 + 1);
  }
  sVar2 = ((Buffer<char> *)&pBVar4->_vptr_Buffer)->size_;
  ((Buffer<char> *)&pBVar4->_vptr_Buffer)->size_ = sVar2 + 1;
  ((Buffer<char> *)&pBVar4->_vptr_Buffer)->ptr_[sVar2] = ')';
  pcVar3 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->ptr_;
  sVar2 = ((Buffer<char> *)&(local_258.buffer_)->_vptr_Buffer)->size_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  local_258._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_002f1120;
  local_248.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_002f1168;
  if (local_248.super_Buffer<char>.ptr_ != pcVar1) {
    operator_delete(local_248.super_Buffer<char>.ptr_,local_248.super_Buffer<char>.capacity_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MakeVarArg(std::string op, const std::vector<std::string> &args) {
    fmt::MemoryWriter w;
    w << op << '(';
    WriteList(w, args);
    w << ')';
    return w.str();
  }